

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O1

int av1_setup_sms_tree(AV1_COMP *cpi,ThreadData_conflict *td)

{
  undefined8 *puVar1;
  BLOCK_SIZE BVar2;
  SIMPLE_MOTION_DATA_TREE *pSVar3;
  SIMPLE_MOTION_DATA_TREE *tree;
  SIMPLE_MOTION_DATA_TREE *pSVar4;
  SIMPLE_MOTION_DATA_TREE *pSVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  size_t num;
  bool bVar13;
  undefined1 auVar14 [16];
  
  if ((cpi->oxcf).kf_cfg.key_freq_max == 0) {
    return 0;
  }
  if ((cpi->oxcf).pass == AOM_RC_FIRST_PASS) {
    bVar13 = false;
  }
  else {
    bVar13 = cpi->compressor_stage != '\x01';
  }
  BVar2 = ((cpi->common).seq_params)->sb_size;
  aom_free(td->sms_tree);
  num = 1;
  if (bVar13) {
    num = (ulong)(BVar2 == BLOCK_128X128) << 10 | 0x155;
  }
  pSVar4 = (SIMPLE_MOTION_DATA_TREE *)aom_calloc(num,0x78);
  td->sms_tree = pSVar4;
  if (pSVar4 == (SIMPLE_MOTION_DATA_TREE *)0x0) {
    iVar11 = -1;
  }
  else {
    if (bVar13) {
      uVar7 = 0x100;
      if (BVar2 == BLOCK_128X128) {
        uVar7 = 0x400;
      }
      uVar8 = 0;
      pSVar5 = pSVar4;
      do {
        pSVar5->block_size = BLOCK_4X4;
        uVar8 = uVar8 + 1;
        pSVar5 = pSVar5 + 1;
      } while (uVar7 != uVar8);
      lVar9 = 1;
      do {
        uVar6 = (uint)uVar7;
        if (3 < uVar6) {
          BVar2 = square[lVar9];
          uVar8 = uVar8 & 0xffffffff;
          lVar10 = uVar8 * 0x78 + 8;
          iVar11 = 0;
          pSVar5 = pSVar4;
          do {
            pSVar3 = td->sms_tree;
            pSVar3[uVar8].block_size = BVar2;
            pSVar4 = pSVar5 + 4;
            lVar12 = 0;
            do {
              auVar14._8_4_ = (int)pSVar5;
              auVar14._0_8_ = pSVar5;
              auVar14._12_4_ = (int)((ulong)pSVar5 >> 0x20);
              puVar1 = (undefined8 *)((long)pSVar3->split + lVar12 * 8 + lVar10 + -8);
              *puVar1 = pSVar5;
              puVar1[1] = auVar14._8_8_ + 0x78;
              lVar12 = lVar12 + 2;
              pSVar5 = pSVar5 + 2;
            } while (lVar12 != 4);
            uVar8 = uVar8 + 1;
            iVar11 = iVar11 + 1;
            lVar10 = lVar10 + 0x78;
            pSVar5 = pSVar4;
          } while (iVar11 != (int)(uVar7 >> 2));
        }
        lVar9 = lVar9 + 1;
        uVar7 = uVar7 >> 2;
      } while (0xf < uVar6);
    }
    else {
      pSVar4->block_size = BLOCK_16X16;
    }
    td->sms_root = td->sms_tree + (num - 1);
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int av1_setup_sms_tree(AV1_COMP *const cpi, ThreadData *td) {
  // The structure 'sms_tree' is used to store the simple motion search data for
  // partition pruning in inter frames. Hence, the memory allocations and
  // initializations related to it are avoided for allintra encoding mode.
  if (cpi->oxcf.kf_cfg.key_freq_max == 0) return 0;

  AV1_COMMON *const cm = &cpi->common;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  int sms_tree_index = 0;
  SIMPLE_MOTION_DATA_TREE *this_sms;
  int square_index = 1;
  int nodes;

  aom_free(td->sms_tree);
  td->sms_tree =
      (SIMPLE_MOTION_DATA_TREE *)aom_calloc(tree_nodes, sizeof(*td->sms_tree));
  if (!td->sms_tree) return -1;
  this_sms = &td->sms_tree[0];

  if (!stat_generation_stage) {
    const int leaf_factor = is_sb_size_128 ? 4 : 1;
    const int leaf_nodes = 256 * leaf_factor;

    // Sets up all the leaf nodes in the tree.
    for (sms_tree_index = 0; sms_tree_index < leaf_nodes; ++sms_tree_index) {
      SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
      tree->block_size = square[0];
    }

    // Each node has 4 leaf nodes, fill each block_size level of the tree
    // from leafs to the root.
    for (nodes = leaf_nodes >> 2; nodes > 0; nodes >>= 2) {
      for (int i = 0; i < nodes; ++i) {
        SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
        tree->block_size = square[square_index];
        for (int j = 0; j < 4; j++) tree->split[j] = this_sms++;
        ++sms_tree_index;
      }
      ++square_index;
    }
  } else {
    // Allocation for firstpass/LAP stage
    // TODO(Mufaddal): refactor square_index to use a common block_size macro
    // from firstpass.c
    SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
    square_index = 2;
    tree->block_size = square[square_index];
  }

  // Set up the root node for the largest superblock size
  td->sms_root = &td->sms_tree[tree_nodes - 1];
  return 0;
}